

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O3

int __thiscall ezc3d::ParametersNS::Parameters::remove(Parameters *this,char *__filename)

{
  pointer pGVar1;
  char *pcVar2;
  iterator iVar3;
  out_of_range *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pGVar1 = (this->_groups).
           super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (char *)(((long)(this->_groups).
                           super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 5) *
                   -0x5555555555555555);
  if (__filename <= pcVar2 && (long)pcVar2 - (long)__filename != 0) {
    iVar3 = std::
            vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
            ::_M_erase(&this->_groups,pGVar1 + (long)__filename);
    return (int)iVar3._M_current;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_c8,(unsigned_long)__filename);
  std::operator+(&local_68,"Parameters::group method is trying to access the group ",&local_c8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar5) {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8.field_2._8_8_ = plVar4[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar5;
  }
  local_e8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string
            (&local_88,
             ((long)(this->_groups).
                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_groups).
                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  std::operator+(&local_48,&local_e8,&local_88);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_a8 == plVar6) {
    local_98 = *plVar6;
    lStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar6;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::out_of_range::out_of_range(this_00,(string *)&local_a8);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void ezc3d::ParametersNS::Parameters::remove(size_t idx) {
  if (idx >= nbGroups()) {
    throw std::out_of_range(
        "Parameters::group method is trying to access the group " +
        std::to_string(idx) + " while the maximum number of groups is " +
        std::to_string(nbGroups()) + ".");
  }
  _groups.erase(_groups.begin() + idx);
}